

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_dcbz(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_5;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x60)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x60
                     );
    ctx->access_type = 0x60;
  }
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  pTVar3 = tcg_const_i32_ppc64(tcg_ctx_00,ctx->opcode & 0x3ff000);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_01,INDEX_op_mov_i64,(TCGArg)(ret + (long)tcg_ctx_01),
                          (TCGArg)(arg + (long)tcg_ctx_01));
      }
      goto LAB_00b85efa;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx_01,INDEX_op_add_i64,(TCGArg)(ret + (long)tcg_ctx_01),
                      (TCGArg)((long)&tcg_ctx_01->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx_01));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00b85efa;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,arg);
LAB_00b85efa:
  local_48 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
  local_40 = (TCGTemp *)(ret + (long)tcg_ctx_00);
  local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx_00);
  tcg_gen_callN_ppc64(tcg_ctx_00,helper_dcbz_ppc64,(TCGTemp *)0x0,3,&local_48);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar3 + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_dcbz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv tcgv_addr;
    TCGv_i32 tcgv_op;

    gen_set_access_type(ctx, ACCESS_CACHE);
    tcgv_addr = tcg_temp_new(tcg_ctx);
    tcgv_op = tcg_const_i32(tcg_ctx, ctx->opcode & 0x03FF000);
    gen_addr_reg_index(ctx, tcgv_addr);
    gen_helper_dcbz(tcg_ctx, tcg_ctx->cpu_env, tcgv_addr, tcgv_op);
    tcg_temp_free(tcg_ctx, tcgv_addr);
    tcg_temp_free_i32(tcg_ctx, tcgv_op);
}